

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
PS2KeyboardSimulationDataGenerator::SendPauseBreakKey(PS2KeyboardSimulationDataGenerator *this)

{
  SendByte(this,0xe1);
  SendByte(this,'\x14');
  SendByte(this,'w');
  SendByte(this,0xe1);
  SendByte(this,0xf0);
  SendByte(this,'\x14');
  SendByte(this,0xf0);
  SendByte(this,'w');
  return;
}

Assistant:

void PS2KeyboardSimulationDataGenerator::SendPauseBreakKey()
{
    // make
    SendByte( 0xE1 );
    SendByte( 0x14 );
    SendByte( 0x77 );
    SendByte( 0xE1 );
    SendByte( 0xF0 );
    SendByte( 0x14 );
    SendByte( 0xF0 );
    SendByte( 0x77 );

    // there is no break code for this key
}